

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicy.cpp
# Opt level: O0

void __thiscall
pgi::JointPolicy::JointPolicy
          (JointPolicy *this,
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          *locals)

{
  undefined1 uVar1;
  uint uVar2;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_>,_bool> pVar3;
  Combination *qc;
  const_iterator __end2;
  const_iterator __begin2;
  combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *__range2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  v;
  uint steps;
  joint_vertex_t current_joint_vertex;
  const_iterator *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_> in_stack_fffffffffffffe68;
  pointer *in_stack_fffffffffffffe70;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe90;
  uint uVar4;
  undefined4 in_stack_fffffffffffffe94;
  pointer *comb;
  pointer *x;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *this_00;
  undefined1 *puVar5;
  pair<const_unsigned_long,_unsigned_int> local_130 [5];
  undefined1 local_d8 [24];
  undefined1 *local_c0;
  combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_68;
  combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_58;
  uint local_34;
  unsigned_long local_30 [3];
  undefined1 local_11 [17];
  
  puVar5 = local_11;
  this_00 = in_RDI;
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
               *)0x2f9a5b);
  boost::bimaps::
  bimap<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>
  ::bimap((bimap<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>
           *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
          (allocator_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::~allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                *)0x2f9a79);
  comb = &in_RDI[2].
          super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[4].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[4].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[3].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[3].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[2].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[3].
  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::map((map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
         *)0x2f9a9e);
  x = &in_RDI[4].
       super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ::vector(this_00,in_RDI);
  local_30[0] = 0;
  local_34 = 0;
  while( true ) {
    uVar4 = local_34;
    uVar2 = find_max_steps((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                            *)in_stack_fffffffffffffe70);
    if (uVar2 < uVar4) break;
    vertices_with_n_steps((uint)((ulong)puVar5 >> 0x20),this_00);
    make_combinations<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)in_stack_fffffffffffffe78);
    local_58 = &local_68;
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::begin((combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)in_stack_fffffffffffffe58);
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::end((combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)in_stack_fffffffffffffe58);
    while( true ) {
      uVar1 = combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::const_iterator::operator!=
                        ((const_iterator *)
                         CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      if (!(bool)uVar1) break;
      in_stack_fffffffffffffe78 = in_RDI;
      combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::const_iterator::operator*(in_stack_fffffffffffffe58);
      local_c0 = local_d8;
      in_RDI = in_stack_fffffffffffffe78;
      get_combination<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)comb);
      boost::bimaps::relation::
      mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
      ::mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                         *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                        (param_type)in_stack_fffffffffffffe58,(param_type)0x2f9cf5);
      boost::bimaps::container_adaptor::container_adaptor<$39681665$>::insert
                ((container_adaptor<_39681665_> *)in_RDI,(param_type)x);
      boost::bimaps::relation::
      mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
      ::~mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                          *)0x2f9d20);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70)
      ;
      in_stack_fffffffffffffe70 =
           &in_RDI[2].
            super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::pair<const_unsigned_long,_unsigned_int>::pair<unsigned_long_&,_unsigned_int_&,_true>
                (local_130,local_30,&local_34);
      pVar3 = std::
              map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
              ::insert((map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                        *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68._M_node)
      ;
      in_stack_fffffffffffffe68 = pVar3.first._M_node;
      in_stack_fffffffffffffe67 = pVar3.second;
      local_30[0] = local_30[0] + 1;
      std::
      vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~vector((vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)in_stack_fffffffffffffe70);
      combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::const_iterator::operator++((const_iterator *)CONCAT17(uVar1,in_stack_fffffffffffffe88));
    }
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::const_iterator::~const_iterator((const_iterator *)0x2f9bab);
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::const_iterator::~const_iterator((const_iterator *)0x2f9bb8);
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~combinations(&local_68);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffffe70);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

JointPolicy::JointPolicy(const std::vector<PolicyGraph>& locals)
    : vm(), stepmap(), locals_(locals) {
  joint_vertex_t current_joint_vertex = 0;

  for (unsigned int steps = 0; steps <= find_max_steps(locals); ++steps) {
    auto v = vertices_with_n_steps(steps, locals);
    for (const auto& qc : make_combinations(v)) {
      vm.insert(vm_type::value_type(current_joint_vertex, get_combination(qc)));
      stepmap.insert(nm_type::value_type(current_joint_vertex, steps));
      ++current_joint_vertex;
    }
  }
}